

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  ArrayIndex index;
  bool bVar1;
  ArrayIndex AVar2;
  undefined1 *this_00;
  PathArgument *arg;
  pointer pPVar3;
  bool bVar4;
  
  pPVar3 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = pPVar3 == (this->args_).
                    super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  this_00 = (undefined1 *)root;
  while (!bVar4) {
    bVar1 = true;
    if (pPVar3->kind_ == kindKey) {
      if (((Value *)this_00)->field_0x8 == '\a') {
        this_00 = (undefined1 *)Value::operator[]((Value *)this_00,(pPVar3->key_)._M_dataplus._M_p);
        if (this_00 == kNull) {
          Value::Value(__return_storage_ptr__,defaultValue);
          bVar1 = false;
          this_00 = kNull;
        }
      }
      else {
        Value::Value(__return_storage_ptr__,defaultValue);
        bVar1 = false;
      }
    }
    else if (pPVar3->kind_ == kindIndex) {
      if (((Value *)this_00)->field_0x8 == '\x06') {
        index = pPVar3->index_;
        AVar2 = Value::size((Value *)this_00);
        if (index < AVar2) {
          this_00 = (undefined1 *)Value::operator[]((Value *)this_00,index);
          goto LAB_00113056;
        }
      }
      Value::Value(__return_storage_ptr__,defaultValue);
      bVar1 = false;
    }
LAB_00113056:
    if (!bVar1) break;
    pPVar3 = pPVar3 + 1;
    bVar4 = pPVar3 == (this->args_).
                      super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  }
  if (bVar4) {
    Value::Value(__return_storage_ptr__,(Value *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::null)
        return defaultValue;
    }
  }
  return *node;
}